

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

char * PatchFormatStringFloatToInt(char *fmt)

{
  char cVar1;
  char *pcVar2;
  char *fmt_00;
  char *buf;
  
  cVar1 = *fmt;
  fmt_00 = fmt;
  if (cVar1 != '\0') {
    if ((((cVar1 == '%') && (fmt[1] == '.')) && (fmt[2] == '0')) &&
       ((fmt[3] == 'f' && (fmt[4] == '\0')))) goto LAB_0017bc2f;
    do {
      if ((cVar1 == '%') && (fmt_00[1] != '%')) break;
      fmt_00 = fmt_00 + (ulong)(cVar1 == '%') + 1;
      cVar1 = *fmt_00;
    } while (cVar1 != '\0');
  }
  pcVar2 = ImParseFormatFindEnd(fmt_00);
  if (pcVar2 <= fmt_00) {
    return fmt;
  }
  if (pcVar2[-1] != 'f') {
    return fmt;
  }
  if ((fmt_00 != fmt) || (*pcVar2 != '\0')) {
    buf = GImGui->TempBuffer;
    ImFormatString(buf,0xc01,"%.*s%%d%s",(ulong)(uint)((int)fmt_00 - (int)fmt),fmt,pcVar2);
    return buf;
  }
LAB_0017bc2f:
  return "%d";
}

Assistant:

static const char* PatchFormatStringFloatToInt(const char* fmt)
{
    if (fmt[0] == '%' && fmt[1] == '.' && fmt[2] == '0' && fmt[3] == 'f' && fmt[4] == 0) // Fast legacy path for "%.0f" which is expected to be the most common case.
        return "%d";
    const char* fmt_start = ImParseFormatFindStart(fmt);    // Find % (if any, and ignore %%)
    const char* fmt_end = ImParseFormatFindEnd(fmt_start);  // Find end of format specifier, which itself is an exercise of confidence/recklessness (because snprintf is dependent on libc or user).
    if (fmt_end > fmt_start && fmt_end[-1] == 'f')
    {
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
        if (fmt_start == fmt && fmt_end[0] == 0)
            return "%d";
        ImGuiContext& g = *GImGui;
        ImFormatString(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), "%.*s%%d%s", (int)(fmt_start - fmt), fmt, fmt_end); // Honor leading and trailing decorations, but lose alignment/precision.
        return g.TempBuffer;
#else
        IM_ASSERT(0 && "DragInt(): Invalid format string!"); // Old versions used a default parameter of "%.0f", please replace with e.g. "%d"
#endif
    }
    return fmt;
}